

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

void __thiscall nuraft::buffer::put_raw(buffer *this,byte *ba,size_t len)

{
  uint uVar1;
  long lVar2;
  overflow_error *this_00;
  uint uVar3;
  uint uVar4;
  
  uVar1 = *(uint *)this;
  if ((int)uVar1 < 0) {
    uVar3 = uVar1 & 0x7fffffff;
  }
  else {
    uVar3 = (uint)*(ushort *)this;
  }
  if ((int)uVar1 < 0) {
    uVar4 = *(uint *)(this + 4);
  }
  else {
    uVar4 = (uint)*(ushort *)(this + 2);
  }
  if (len <= (ulong)uVar3 - (ulong)uVar4) {
    if ((int)uVar1 < 0) {
      lVar2 = (ulong)*(uint *)(this + 4) + 8;
    }
    else {
      lVar2 = (ulong)*(ushort *)(this + 2) + 4;
    }
    memcpy(this + lVar2,ba,len);
    if (*(int *)this < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + (int)len;
    }
    else {
      *(short *)(this + 2) = *(short *)(this + 2) + (short)len;
    }
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"insufficient buffer to store a raw byte array");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer::put_raw(const byte* ba, size_t len) {
    if ( size() - pos() < len) {
        throw std::overflow_error
              ( "insufficient buffer to store a raw byte array" );
    }

    ::memcpy(data(), ba, len);
    __mv_fw_block(this, len);
}